

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_interactive.cpp
# Opt level: O2

CapturedMouse __thiscall ftxui::ScreenInteractive::CaptureMouse(ScreenInteractive *this)

{
  undefined8 *puVar1;
  long in_RSI;
  function<void_()> local_38;
  
  if (*(char *)(in_RSI + 0x9c) == '\0') {
    *(undefined1 *)(in_RSI + 0x9c) = 1;
    puVar1 = (undefined8 *)operator_new(0x28);
    local_38.super__Function_base._M_functor._8_8_ = 0;
    local_38._M_invoker =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O2/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:274:7)>
         ::_M_invoke;
    local_38.super__Function_base._M_manager =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O2/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:274:7)>
         ::_M_manager;
    *puVar1 = &PTR__CapturedMouseImpl_001689d0;
    std::function<void_()>::function((function<void_()> *)(puVar1 + 1),&local_38);
    std::_Function_base::~_Function_base(&local_38.super__Function_base);
  }
  else {
    puVar1 = (undefined8 *)0x0;
  }
  *(undefined8 **)&(this->super_Screen).stencil = puVar1;
  return (__uniq_ptr_data<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>,_true,_true>
          )(__uniq_ptr_data<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>,_true,_true>
            )this;
}

Assistant:

CapturedMouse ScreenInteractive::CaptureMouse() {
  if (mouse_captured)
    return nullptr;
  mouse_captured = true;
  return std::make_unique<CapturedMouseImpl>(
      [this] { mouse_captured = false; });
}